

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformservices.cpp
# Opt level: O0

bool __thiscall QPlatformServices::openDocument(QPlatformServices *this,QUrl *url)

{
  char *pcVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff68;
  char *pcVar2;
  uint in_stack_ffffffffffffff78;
  ComponentFormattingOption f;
  QMessageLogger *in_stack_ffffffffffffff80;
  QString *s;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_5c;
  QString local_58 [2];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  f = PrettyDecoded;
  pcVar2 = local_28;
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffff80,(char *)(ulong)in_stack_ffffffffffffff78,
             (int)((ulong)pcVar2 >> 0x20),in_stack_ffffffffffffff68);
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
            (&local_5c,f);
  s = local_58;
  QUrl::toString((QUrlTwoFlags *)s);
  QtPrivate::asString(s);
  QString::toLocal8Bit(s);
  pcVar1 = QByteArray::constData((QByteArray *)0x3e02f4);
  QMessageLogger::warning
            (pcVar2,"This plugin does not support QPlatformServices::openDocument() for \'%s\'.",
             pcVar1);
  QByteArray::~QByteArray((QByteArray *)0x3e0316);
  QString::~QString((QString *)0x3e0320);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QPlatformServices::openDocument(const QUrl &url)
{
    qWarning("This plugin does not support QPlatformServices::openDocument() for '%s'.",
             qPrintable(url.toString()));
    return false;
}